

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopClear(sqlite3 *db,WhereLoop *p)

{
  WhereLoop *p_local;
  sqlite3 *db_local;
  
  if (p->aLTerm != p->aLTermSpace) {
    sqlite3DbFreeNN(db,p->aLTerm);
    p->aLTerm = p->aLTermSpace;
    p->nLSlot = 3;
  }
  whereLoopClearUnion(db,p);
  p->nLTerm = 0;
  p->wsFlags = 0;
  return;
}

Assistant:

static void whereLoopClear(sqlite3 *db, WhereLoop *p){
  if( p->aLTerm!=p->aLTermSpace ){
    sqlite3DbFreeNN(db, p->aLTerm);
    p->aLTerm = p->aLTermSpace;
    p->nLSlot = ArraySize(p->aLTermSpace);
  }
  whereLoopClearUnion(db, p);
  p->nLTerm = 0;
  p->wsFlags = 0;
}